

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
AddCordRep<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *tree,CordRep *rep)

{
  size_t delta;
  CordRepBtree *pCVar1;
  uint depth;
  OpResult OVar2;
  OpResult result;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> ops;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> local_90;
  
  depth = (uint)(tree->super_CordRep).storage[0];
  delta = rep->length;
  pCVar1 = anon_unknown_0::
           StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::BuildStack
                     (&local_90,tree,depth);
  OVar2 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                    (pCVar1,(int)depth < local_90.share_depth,rep,delta);
  result._12_4_ = 0;
  result.tree = (CordRepBtree *)SUB128(OVar2._0_12_,0);
  result.action = SUB124(OVar2._0_12_,8);
  pCVar1 = anon_unknown_0::
           StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::
           Unwind<false>(&local_90,tree,depth,delta,result);
  return pCVar1;
}

Assistant:

CordRepBtree* CordRepBtree::AddCordRep(CordRepBtree* tree, CordRep* rep) {
  const int depth = tree->height();
  const size_t length = rep->length;
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);
  const OpResult result =
      leaf->AddEdge<edge_type>(ops.owned(depth), rep, length);
  return ops.Unwind(tree, depth, length, result);
}